

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

uint64_t getVoronoiSHA(uint64_t seed)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined8 in_RDI;
  uint local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  uint local_164;
  uint local_160;
  uint local_15c;
  uint local_158 [63];
  uint32_t y;
  uint32_t x;
  uint32_t i;
  uint32_t a7;
  uint32_t a6;
  uint32_t a5;
  uint32_t a4;
  uint32_t a3;
  uint32_t a2;
  uint32_t a1;
  uint32_t a0;
  
  uVar2 = (uint)in_RDI;
  local_158[0] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar2 = (uint)((ulong)in_RDI >> 0x20);
  local_158[1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  local_158[2] = 0x80000000;
  for (local_17c = 3; local_17c < 0xf; local_17c = local_17c + 1) {
    local_158[local_17c] = 0;
  }
  local_158[0xf] = 0x40;
  for (local_17c = 0x10; local_17c < 0x40; local_17c = local_17c + 1) {
    local_158[local_17c] = local_158[local_17c - 7] + local_158[local_17c - 0x10];
    uVar2 = local_158[local_17c - 0xf];
    local_158[local_17c] =
         ((uVar2 >> 7 | uVar2 << 0x19) ^ (uVar2 >> 0x12 | uVar2 << 0xe) ^ uVar2 >> 3) +
         local_158[local_17c];
    uVar2 = local_158[local_17c - 2];
    local_158[local_17c] =
         ((uVar2 >> 0x11 | uVar2 << 0xf) ^ (uVar2 >> 0x13 | uVar2 << 0xd) ^ uVar2 >> 10) +
         local_158[local_17c];
  }
  local_15c = 0x6a09e667;
  local_160 = 0xbb67ae85;
  local_164 = 0x3c6ef372;
  local_168 = 0xa54ff53a;
  local_16c = 0x510e527f;
  local_170 = 0x9b05688c;
  local_174 = 0x1f83d9ab;
  local_178 = 0x5be0cd19;
  for (local_17c = 0; local_17c < 0x40; local_17c = local_17c + 1) {
    iVar1 = (local_16c & local_170 ^ (local_16c ^ 0xffffffff) & local_174) +
            ((local_16c >> 6 | local_16c << 0x1a) ^ (local_16c >> 0xb | local_16c << 0x15) ^
            (local_16c >> 0x19 | local_16c << 7)) +
            local_178 + getVoronoiSHA::K[local_17c] + local_158[local_17c];
    uVar2 = local_15c & local_160;
    uVar3 = local_15c & local_164;
    uVar4 = local_160 & local_164;
    local_178 = local_174;
    local_174 = local_170;
    local_170 = local_16c;
    local_16c = local_168 + iVar1;
    local_168 = local_164;
    local_164 = local_160;
    local_160 = local_15c;
    local_15c = iVar1 + (uVar2 ^ uVar3 ^ uVar4) +
                        ((local_15c >> 2 | local_15c << 0x1e) ^
                         (local_15c >> 0xd | local_15c << 0x13) ^
                        (local_15c >> 0x16 | local_15c << 10));
  }
  local_15c = local_15c + 0x6a09e667;
  local_160 = local_160 + 0xbb67ae85;
  return CONCAT44(local_160 >> 0x18 | (local_160 & 0xff0000) >> 8 | (local_160 & 0xff00) << 8 |
                  local_160 * 0x1000000,
                  local_15c >> 0x18 | (local_15c & 0xff0000) >> 8 | (local_15c & 0xff00) << 8 |
                  local_15c * 0x1000000);
}

Assistant:

uint64_t getVoronoiSHA(uint64_t seed)
{
    static const uint32_t K[64] = {
        0x428a2f98,0x71374491, 0xb5c0fbcf,0xe9b5dba5,
        0x3956c25b,0x59f111f1, 0x923f82a4,0xab1c5ed5,
        0xd807aa98,0x12835b01, 0x243185be,0x550c7dc3,
        0x72be5d74,0x80deb1fe, 0x9bdc06a7,0xc19bf174,
        0xe49b69c1,0xefbe4786, 0x0fc19dc6,0x240ca1cc,
        0x2de92c6f,0x4a7484aa, 0x5cb0a9dc,0x76f988da,
        0x983e5152,0xa831c66d, 0xb00327c8,0xbf597fc7,
        0xc6e00bf3,0xd5a79147, 0x06ca6351,0x14292967,
        0x27b70a85,0x2e1b2138, 0x4d2c6dfc,0x53380d13,
        0x650a7354,0x766a0abb, 0x81c2c92e,0x92722c85,
        0xa2bfe8a1,0xa81a664b, 0xc24b8b70,0xc76c51a3,
        0xd192e819,0xd6990624, 0xf40e3585,0x106aa070,
        0x19a4c116,0x1e376c08, 0x2748774c,0x34b0bcb5,
        0x391c0cb3,0x4ed8aa4a, 0x5b9cca4f,0x682e6ff3,
        0x748f82ee,0x78a5636f, 0x84c87814,0x8cc70208,
        0x90befffa,0xa4506ceb, 0xbef9a3f7,0xc67178f2,
    };
    static const uint32_t B[8] = {
        0x6a09e667,0xbb67ae85, 0x3c6ef372,0xa54ff53a,
        0x510e527f,0x9b05688c, 0x1f83d9ab,0x5be0cd19,
    };

    uint32_t m[64];
    uint32_t a0,a1,a2,a3,a4,a5,a6,a7;
    uint32_t i, x, y;
    m[0] = BSWAP32((uint32_t)(seed));
    m[1] = BSWAP32((uint32_t)(seed >> 32));
    m[2] = 0x80000000;
    for (i = 3; i < 15; i++)
        m[i] = 0;
    m[15] = 0x00000040;

    for (i = 16; i < 64; ++i)
    {
        m[i] = m[i - 7] + m[i - 16];
        x = m[i - 15];
        m[i] += rotr32(x,7) ^ rotr32(x,18) ^ (x >> 3);
        x = m[i - 2];
        m[i] += rotr32(x,17) ^ rotr32(x,19) ^ (x >> 10);
    }

    a0 = B[0];
    a1 = B[1];
    a2 = B[2];
    a3 = B[3];
    a4 = B[4];
    a5 = B[5];
    a6 = B[6];
    a7 = B[7];

    for (i = 0; i < 64; i++)
    {
        x = a7 + K[i] + m[i];
        x += rotr32(a4,6) ^ rotr32(a4,11) ^ rotr32(a4,25);
        x += (a4 & a5) ^ (~a4 & a6);

        y = rotr32(a0,2) ^ rotr32(a0,13) ^ rotr32(a0,22);
        y += (a0 & a1) ^ (a0 & a2) ^ (a1 & a2);

        a7 = a6;
        a6 = a5;
        a5 = a4;
        a4 = a3 + x;
        a3 = a2;
        a2 = a1;
        a1 = a0;
        a0 = x + y;
    }

    a0 += B[0];
    a1 += B[1];

    return BSWAP32(a0) | ((uint64_t)BSWAP32(a1) << 32);
}